

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

void HTS_Vocoder_initialize
               (HTS_Vocoder *v,size_t m,size_t stage,HTS_Boolean use_log_gain,size_t rate,
               size_t fperiod)

{
  double *pdVar1;
  size_t num;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  v->is_first = '\x01';
  v->stage = stage;
  dVar2 = 0.0;
  if (stage != 0) {
    auVar3._8_4_ = (int)(stage >> 0x20);
    auVar3._0_8_ = stage;
    auVar3._12_4_ = 0x45300000;
    dVar2 = -1.0 / ((auVar3._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)stage) - 4503599627370496.0));
  }
  v->gamma = dVar2;
  v->use_log_gain = use_log_gain;
  v->fprd = fperiod;
  v->next = 1;
  v->gauss = '\x01';
  auVar4._8_4_ = (int)(rate >> 0x20);
  auVar4._0_8_ = rate;
  auVar4._12_4_ = 0x45300000;
  v->rate = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)rate) - 4503599627370496.0);
  v->pitch_of_curr_point = 0.0;
  v->pitch_counter = 0.0;
  v->pitch_inc_per_point = 0.0;
  v->excite_ring_buff = (double *)0x0;
  v->excite_buff_size = 0;
  v->excite_buff_index = 0;
  v->sw = '\0';
  v->x = 0x55555555;
  v->freqt_buff = (double *)0x0;
  v->freqt_size = 0;
  v->spectrum2en_buff = (double *)0x0;
  v->spectrum2en_size = 0;
  v->postfilter_buff = (double *)0x0;
  v->postfilter_size = 0;
  v->lsp2lpc_buff = (double *)0x0;
  v->lsp2lpc_size = 0;
  v->gc2gc_buff = (double *)0x0;
  v->gc2gc_size = 0;
  if (stage == 0) {
    num = m * 8 + 0x1f;
  }
  else {
    num = (stage + 3) * (m + 1);
  }
  pdVar1 = (double *)HTS_calloc(num,8);
  v->c = pdVar1;
  v->cc = pdVar1 + m + 1;
  v->cinc = pdVar1 + m * 2 + 2;
  v->d1 = pdVar1 + m * 3 + 3;
  return;
}

Assistant:

void HTS_Vocoder_initialize(HTS_Vocoder * v, size_t m, size_t stage, HTS_Boolean use_log_gain, size_t rate, size_t fperiod)
{
   /* set parameter */
   v->is_first = TRUE;
   v->stage = stage;
   if (stage != 0)
      v->gamma = -1.0 / v->stage;
   else
      v->gamma = 0.0;
   v->use_log_gain = use_log_gain;
   v->fprd = fperiod;
   v->next = SEED;
   v->gauss = GAUSS;
   v->rate = rate;
   v->pitch_of_curr_point = 0.0;
   v->pitch_counter = 0.0;
   v->pitch_inc_per_point = 0.0;
   v->excite_ring_buff = NULL;
   v->excite_buff_size = 0;
   v->excite_buff_index = 0;
   v->sw = 0;
   v->x = 0x55555555;
   /* init buffer */
   v->freqt_buff = NULL;
   v->freqt_size = 0;
   v->gc2gc_buff = NULL;
   v->gc2gc_size = 0;
   v->lsp2lpc_buff = NULL;
   v->lsp2lpc_size = 0;
   v->postfilter_buff = NULL;
   v->postfilter_size = 0;
   v->spectrum2en_buff = NULL;
   v->spectrum2en_size = 0;
   if (v->stage == 0) {         /* for MCP */
      v->c = (double *) HTS_calloc(m * (3 + PADEORDER) + 5 * PADEORDER + 6, sizeof(double));
      v->cc = v->c + m + 1;
      v->cinc = v->cc + m + 1;
      v->d1 = v->cinc + m + 1;
   } else {                     /* for LSP */
      v->c = (double *) HTS_calloc((m + 1) * (v->stage + 3), sizeof(double));
      v->cc = v->c + m + 1;
      v->cinc = v->cc + m + 1;
      v->d1 = v->cinc + m + 1;
   }
}